

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField64.c
# Opt level: O2

void Hacl_GenericField64_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *aM,uint32_t bBits,
               uint64_t *b,uint64_t *resM)

{
  uint64_t *puVar1;
  size_t sVar2;
  size_t __n;
  uint len;
  uint64_t *puVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint32_t uVar7;
  uint64_t *puVar9;
  uint64_t *puVar10;
  ulong uVar11;
  uint32_t i;
  uint uVar12;
  ulong uVar13;
  uint64_t *ctx_n0;
  uint uVar14;
  uint64_t uStack_b0;
  ulong local_a8;
  uint64_t *local_a0;
  uint64_t *t11_3;
  uint64_t *t11_2;
  uint64_t *t11_1;
  ulong local_80;
  uint64_t *local_78;
  uint64_t *ctx_n;
  uint64_t *local_68;
  uint64_t *local_60;
  uint64_t *t11;
  uint64_t *ctx_r2;
  uint64_t *local_48;
  size_t local_40;
  uint64_t local_38;
  uint64_t *puVar8;
  
  len = k->len;
  uVar11 = (ulong)len;
  t11 = k->n;
  local_38 = k->mu;
  ctx_r2 = k->r2;
  uVar13 = uVar11 * 8 + 0xf & 0xfffffffffffffff0;
  puVar10 = (uint64_t *)((long)&local_a8 + -uVar13);
  sVar2 = uVar11 * 8;
  t11_1 = b;
  local_48 = puVar10;
  *(undefined8 *)((long)&uStack_b0 + -uVar13) = 0x17d353;
  memcpy(puVar10,aM,sVar2);
  local_80 = (ulong)bBits;
  local_68 = resM;
  if (bBits < 200) {
    puVar10 = puVar10 + -(ulong)(len * 2);
    puVar10[-1] = 0x17d389;
    memset(puVar10,0,(ulong)(len * 2) * 8);
    puVar3 = t11;
    puVar10[-1] = 0x17d398;
    memcpy(puVar10,puVar3,sVar2);
    puVar3 = ctx_r2;
    puVar10[-1] = 0x17d3ab;
    memcpy(puVar10 + uVar11,puVar3,sVar2);
    uVar5 = local_38;
    puVar3 = local_68;
    puVar10[-1] = 0x17d3c1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len,puVar10,uVar5,puVar10 + uVar11,puVar3);
    uVar5 = local_38;
    puVar3 = local_48;
    for (uVar11 = 0; puVar1 = local_68, (int)local_80 != (int)uVar11;
        uVar11 = (ulong)((int)uVar11 + 1)) {
      if ((t11_1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0) {
        puVar10[-1] = 0x17d3ff;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar10,uVar5,puVar1,puVar3,puVar1);
      }
      puVar10[-1] = 0x17d413;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar10,uVar5,puVar3,puVar3);
    }
  }
  else {
    ctx_n._4_4_ = (bBits - 1 >> 6) + 1;
    local_60 = (uint64_t *)(ulong)(len * 2);
    __n = (long)local_60 * 8;
    puVar10 = puVar10 + -(long)local_60;
    local_78 = puVar10;
    puVar10[-1] = 0x17d44b;
    memset(puVar10,0,__n);
    puVar3 = t11;
    puVar10[-1] = 0x17d45a;
    memcpy(puVar10,puVar3,sVar2);
    puVar3 = ctx_r2;
    t11 = puVar10 + uVar11;
    puVar10[-1] = 0x17d46e;
    memcpy(puVar10 + uVar11,puVar3,sVar2);
    puVar10 = puVar10 + -(ulong)(len << 4);
    puVar10[-1] = 0x17d48b;
    memset(puVar10,0,(ulong)(len << 4) * 8);
    puVar9 = (uint64_t *)((long)puVar10 - uVar13);
    local_a8 = uVar13;
    puVar9[-1] = 0x17d4a8;
    memset(puVar9,0,sVar2);
    uVar5 = local_38;
    puVar1 = t11;
    puVar3 = local_78;
    ctx_r2 = puVar10;
    local_40 = sVar2;
    puVar9[-1] = 0x17d4d1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len,puVar3,uVar5,puVar1,puVar10);
    sVar2 = local_40;
    puVar1 = local_48;
    puVar9[-1] = 0x17d4e1;
    memcpy(puVar10 + uVar11,puVar1,sVar2);
    puVar9[-1] = 0x17d4f5;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10 + uVar11,puVar9);
    sVar2 = local_40;
    puVar1 = ctx_r2;
    puVar10 = ctx_r2 + (long)local_60;
    puVar9[-1] = 0x17d510;
    memcpy(puVar10,puVar9,sVar2);
    uVar5 = local_38;
    puVar8 = local_48;
    puVar3 = local_78;
    puVar9[-1] = 0x17d52d;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar8,puVar10,puVar9);
    sVar2 = local_40;
    local_60 = puVar1 + len * 3;
    puVar9[-1] = 0x17d545;
    memcpy(puVar1 + len * 3,puVar9,sVar2);
    uVar5 = local_38;
    puVar9[-1] = 0x17d55a;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar10 = puVar1 + len * 4;
    t11_2 = puVar10;
    puVar9[-1] = 0x17d57f;
    memcpy(puVar10,puVar9,sVar2);
    uVar5 = local_38;
    puVar8 = local_48;
    puVar9[-1] = 0x17d598;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar8,puVar10,puVar9);
    sVar2 = local_40;
    t11_3 = puVar1 + len * 5;
    puVar9[-1] = 0x17d5bd;
    memcpy(puVar1 + len * 5,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = local_60;
    puVar9[-1] = 0x17d5d6;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar10 = puVar1 + len * 6;
    local_a0 = puVar10;
    puVar9[-1] = 0x17d5f4;
    memcpy(puVar10,puVar9,sVar2);
    uVar5 = local_38;
    puVar8 = local_48;
    puVar9[-1] = 0x17d60d;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar8,puVar10,puVar9);
    sVar2 = local_40;
    local_60 = puVar1 + len * 7;
    puVar9[-1] = 0x17d628;
    memcpy(puVar1 + len * 7,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = t11_2;
    puVar9[-1] = 0x17d644;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar9[-1] = 0x17d65f;
    memcpy(puVar1 + len * 8,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = local_48;
    puVar9[-1] = 0x17d678;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar10,puVar1 + len * 8,puVar9);
    sVar2 = local_40;
    puVar9[-1] = 0x17d68c;
    memcpy(puVar1 + len * 9,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = t11_3;
    puVar9[-1] = 0x17d6a5;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar9[-1] = 0x17d6bc;
    memcpy(puVar1 + len * 10,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = local_48;
    puVar9[-1] = 0x17d6dc;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar10,puVar1 + len * 10,puVar9);
    sVar2 = local_40;
    puVar1 = ctx_r2;
    puVar10 = ctx_r2 + len * 0xb;
    puVar9[-1] = 0x17d6fb;
    memcpy(puVar10,puVar9,sVar2);
    puVar10 = local_a0;
    puVar9[-1] = 0x17d713;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar9[-1] = 0x17d731;
    memcpy(puVar1 + len * 0xc,puVar9,sVar2);
    puVar10 = local_48;
    puVar3 = local_78;
    puVar9[-1] = 0x17d74d;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar10,puVar1 + len * 0xc,puVar9);
    sVar2 = local_40;
    puVar1 = ctx_r2;
    puVar10 = ctx_r2 + len * 0xd;
    puVar9[-1] = 0x17d765;
    memcpy(puVar10,puVar9,sVar2);
    uVar5 = local_38;
    puVar10 = local_60;
    puVar9[-1] = 0x17d77e;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar3,uVar5,puVar10,puVar9);
    sVar2 = local_40;
    puVar10 = puVar1 + len * 0xe;
    puVar9[-1] = 0x17d798;
    memcpy(puVar10,puVar9,sVar2);
    uVar5 = local_38;
    sVar2 = local_40;
    puVar8 = local_48;
    puVar9[-1] = 0x17d7b5;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar3,uVar5,puVar8,puVar10,puVar9);
    uVar7 = (uint32_t)puVar8;
    puVar9[-1] = 0x17d7cf;
    memcpy(puVar1 + len * 0xf,puVar9,sVar2);
    uVar5 = local_38;
    puVar8 = t11;
    puVar1 = local_68;
    uVar4 = ctx_n._4_4_;
    puVar10 = t11_1;
    uVar12 = (uint)local_80;
    if ((local_80 & 3) == 0) {
      puVar9[-1] = 0x17d820;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(len,puVar3,uVar5,puVar8,puVar1);
      uVar14 = uVar12;
    }
    else {
      puVar9[-1] = 0x17d7ef;
      uVar5 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar4,puVar10,uVar12 & 0xfffffffc,uVar7);
      puVar3 = local_68;
      puVar10 = ctx_r2 + (int)uVar5 * len;
      puVar9[-1] = 0x17d807;
      memcpy(puVar3,puVar10,sVar2);
      uVar14 = uVar12 & 0xfffffffc;
    }
    puVar9 = (uint64_t *)((long)puVar9 - local_a8);
    t11 = puVar9;
    puVar9[-1] = 0x17d83e;
    memset(puVar9,0,sVar2);
    puVar3 = local_68;
    puVar10 = local_78;
    uVar11 = (ulong)(uVar12 >> 2);
    while( true ) {
      uVar5 = local_38;
      local_80 = (ulong)((int)uVar11 - 1);
      if ((int)uVar11 == 0) break;
      local_48 = (uint64_t *)CONCAT44(local_48._4_4_,uVar14 - 4);
      puVar9[-1] = 0x17d878;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar10,uVar5,puVar3,puVar3);
      puVar9[-1] = 0x17d88c;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar10,uVar5,puVar3,puVar3);
      puVar9[-1] = 0x17d8a0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar10,uVar5,puVar3,puVar3);
      puVar9[-1] = 0x17d8b4;
      puVar8 = puVar3;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len,puVar10,uVar5,puVar3,puVar3);
      uVar4 = ctx_n._4_4_;
      puVar1 = t11_1;
      uVar7 = (uint32_t)local_48;
      puVar9[-1] = 0x17d8c3;
      uVar6 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar4,puVar1,uVar7,(uint32_t)puVar8);
      sVar2 = local_40;
      puVar8 = t11;
      puVar1 = ctx_r2 + (int)uVar6 * len;
      puVar9[-1] = 0x17d8df;
      memcpy(puVar8,puVar1,sVar2);
      uVar11 = local_80;
      uVar14 = (uint32_t)local_48;
      puVar9[-1] = 0x17d901;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len,puVar10,uVar5,puVar3,puVar8,puVar3);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField64_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *aM,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *resM
)
{
  uint32_t len1 = Hacl_GenericField64_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), k1.len);
  uint64_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint64_t));
  memcpy(aMc, aM, k1.len * sizeof (uint64_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint64_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 64U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len1);
    uint64_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint64_t));
    uint64_t *t0 = table;
    uint64_t *t1 = table + len1;
    uint64_t *ctx_n0 = ctx;
    uint64_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint64_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint64_t *t11 = table + (i + 1U) * len1;
      uint64_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint64_t));
      uint64_t *t2 = table + (2U * i + 2U) * len1;
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint64_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
      uint32_t bits_l32 = (uint32_t)bits_c;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
    }
    else
    {
      uint64_t *ctx_n = ctx;
      uint64_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint64_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint64_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k2, 4U);
      uint32_t bits_l32 = (uint32_t)bits_l;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}